

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

void __thiscall miniros::observer::TargetBase::~TargetBase(TargetBase *this)

{
  Connections *pCVar1;
  
  this->_vptr_TargetBase = (_func_int **)&PTR__TargetBase_002efff0;
  if (this->m_list != (Connections *)0x0) {
    impl::Connections::disconnectAll(this->m_list);
    impl::Connections::detachOwner(this->m_list,this);
    pCVar1 = this->m_list;
    if (pCVar1 != (Connections *)0x0) {
      Connection::~Connection(&pCVar1->m_root);
    }
    operator_delete(pCVar1,0x50);
  }
  this->m_list = (Connections *)0x0;
  return;
}

Assistant:

TargetBase::~TargetBase() {
    assert(m_list);
    if (m_list) {
        m_list->disconnectAll();
        bool detached = m_list->detachOwner(this);
        assert(detached);
        delete m_list;
    }
    m_list = nullptr;
}